

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::NextAfterOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool fun_00;
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  byte in_CL;
  Vector *in_RDX;
  double dVar5;
  double *result_data;
  double *rdata;
  double *ldata;
  ValidityMask *in_stack_ffffffffffffffa8;
  double left_00;
  
  fun_00 = (bool)(in_CL & 1);
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  pdVar2 = ConstantVector::GetData<double>((Vector *)0xdd9f34);
  pdVar3 = ConstantVector::GetData<double>((Vector *)0xdd9f43);
  pdVar4 = ConstantVector::GetData<double>((Vector *)0xdd9f52);
  bVar1 = ConstantVector::IsNull((Vector *)0xdd9f61);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0xdd9f6f), !bVar1)) {
    dVar5 = *pdVar2;
    left_00 = *pdVar3;
    ConstantVector::Validity(in_RDX);
    dVar5 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::NextAfterOperator,double,double,double>
                      (fun_00,left_00,dVar5,in_stack_ffffffffffffffa8,0xdd9fd7);
    *pdVar4 = dVar5;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}